

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.hpp
# Opt level: O2

void __thiscall
sisl::
array_n<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_2,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::~array_n(array_n<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_2,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this)

{
  DenseStorage<double,__1,__1,_1,_0> *pDVar1;
  iterator i;
  DenseStorage<double,__1,__1,_1,_0> *this_00;
  
  if (this->_array != (Matrix<double,__1,_1,_0,__1,_1> *)0x0) {
    this_00 = (DenseStorage<double,__1,__1,_1,_0> *)this->first;
    pDVar1 = (DenseStorage<double,__1,__1,_1,_0> *)this->last;
    if ((this_00 != pDVar1) && (this->_dims[1] * this->_dims[0] != 0)) {
      for (; this_00 < pDVar1; this_00 = this_00 + 1) {
        Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage(this_00);
        pDVar1 = (DenseStorage<double,__1,__1,_1,_0> *)this->last;
      }
      operator_delete(this->first);
    }
  }
  this->_array = (Matrix<double,__1,_1,_0,__1,_1> *)0x0;
  return;
}

Assistant:

~array_n() {
            unsigned int size = 1;
            for(int i = 0; i < N; i++) {
                size *= _dims[i];
            }

            // Check if the array has been allocated in the first place
            if (this->_array != nullptr && first != last && size != 0) {
                for (iterator i = first; i < last; ++i) {
                    Allocator::destroy(i);
                }
                Allocator::deallocate(first, last - first);
            }
            this->_array = nullptr;
        }